

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QToolBarAreaLayout::gapIndex
          (QList<int> *__return_storage_ptr__,QToolBarAreaLayout *this,QPoint *pos)

{
  LayoutDirection direction;
  long lVar1;
  QRect *boundingRect;
  long in_FS_OFFSET;
  QPoint p;
  int minDistance;
  QArrayDataPointer<int> local_68;
  QPoint local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  direction = QWidget::layoutDirection(&this->mainWindow->super_QWidget);
  local_40 = 0x50;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  boundingRect = &this->docks[0].rect;
  lVar1 = 0;
  do {
    local_48 = *pos;
    if (boundingRect[1].x1.m_i == 1) {
      local_48 = QStyle::visualPos(direction,boundingRect,&local_48);
    }
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QToolBarAreaLayoutInfo::gapIndex
              ((QList<int> *)&local_68,(QToolBarAreaLayoutInfo *)&boundingRect[-2].x2,&local_48,
               &local_40);
    if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
      local_3c = (int)lVar1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)&local_68,0,&local_3c);
      QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_68);
    }
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,4,0x10);
      }
    }
    lVar1 = lVar1 + 1;
    boundingRect = (QRect *)&boundingRect[3].x2;
  } while (lVar1 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QToolBarAreaLayout::gapIndex(const QPoint &pos) const
{
    Qt::LayoutDirection dir = mainWindow->layoutDirection();
    int minDistance = 80; // when a dock area is empty, how "wide" is it?
    QList<int> ret; //return value
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QPoint p = pos;
        if (docks[i].o == Qt::Horizontal)
            p = QStyle::visualPos(dir, docks[i].rect, p);
        QList<int> result = docks[i].gapIndex(p, &minDistance);
        if (!result.isEmpty()) {
            result.prepend(i);
            ret = result;
        }
    }

    return ret;
}